

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O0

CBlockIndex * __thiscall ChainstateManager::GetBackgroundSyncTip(ChainstateManager *this)

{
  long lVar1;
  bool bVar2;
  ChainstateManager *in_RDI;
  long in_FS_OFFSET;
  unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *in_stack_ffffffffffffffd8;
  undefined8 local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = BackgroundSyncInProgress(in_RDI);
  if (bVar2) {
    std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator->
              (in_stack_ffffffffffffffd8);
    local_20 = CChain::Tip((CChain *)in_RDI);
  }
  else {
    local_20 = (CBlockIndex *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(GetMutex()) {
        return BackgroundSyncInProgress() ? m_ibd_chainstate->m_chain.Tip() : nullptr;
    }